

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

uint64_t sum_quotients<unsigned_int,libdivide::divider<unsigned_int,(libdivide::Branching)0>>
                   (random_numerators<unsigned_int> *vals,
                   divider<unsigned_int,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  uint uVar2;
  uint64_t yl;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint64_t xl;
  
  uVar3 = (ulong)(div->div).denom.magic;
  bVar1 = (div->div).denom.more;
  uVar5 = 0;
  for (lVar4 = 0; (ulong)vals->_length << 2 != lVar4; lVar4 = lVar4 + 4) {
    uVar2 = *(uint *)((long)vals->_pData + lVar4);
    if (uVar3 == 0) {
      uVar6 = uVar2 >> (bVar1 & 0x1f);
    }
    else {
      uVar6 = (uint)(uVar3 * uVar2 >> 0x20);
      if ((bVar1 & 0x40) == 0) {
        uVar6 = uVar6 >> (bVar1 & 0x1f);
      }
      else {
        uVar6 = (uVar2 - uVar6 >> 1) + uVar6 >> (bVar1 & 0x1f);
      }
    }
    uVar5 = uVar5 + uVar6;
  }
  return (ulong)uVar5;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}